

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O1

void iemgui_dolabelpos(t_object *obj,t_iemgui *iemgui)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  t_symbol *ptVar6;
  _glist *p_Var7;
  int iVar8;
  bool bVar9;
  char tag [128];
  char local_b8 [136];
  
  iVar3 = glist_getzoom(iemgui->x_glist);
  iVar4 = text_xpix(obj,iemgui->x_glist);
  iVar5 = text_ypix(obj,iemgui->x_glist);
  iVar1 = iemgui->x_ldx;
  iVar2 = iemgui->x_ldy;
  sprintf(local_b8,"%lxLABEL",obj);
  ptVar6 = gensym("");
  bVar9 = ptVar6 == iemgui->x_lab;
  if (bVar9) {
    iVar1 = 0;
  }
  iVar8 = 7;
  if (!bVar9) {
    iVar8 = iVar2;
  }
  p_Var7 = glist_getcanvas((_glist *)0x0);
  pdgui_vmess((char *)0x0,"crs ii",p_Var7,"coords",local_b8,(ulong)(uint)(iVar1 * iVar3 + iVar4),
              iVar8 * iVar3 + iVar5);
  return;
}

Assistant:

static void iemgui_dolabelpos(t_object*obj, t_iemgui*iemgui) {
    int zoom = glist_getzoom(iemgui->x_glist);
    int x0 = text_xpix((t_object *)obj, iemgui->x_glist);
    int y0 = text_ypix((t_object *)obj, iemgui->x_glist);
    int dx = iemgui->x_ldx, dy = iemgui->x_ldy;
    char tag[128];
    sprintf(tag, "%lxLABEL", obj);
    if(gensym("") == iemgui->x_lab) {
        /* put empty labels where they don't create scrollbars */
        dx = 0;
        dy = 7;
    }
    pdgui_vmess(0, "crs ii",
        glist_getcanvas(iemgui->x_glist), "coords", tag,
        x0  + dx*zoom, y0 + dy*zoom);
}